

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

void Gia_ManPrintMiterStatus(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Gia_Man_t *pGVar7;
  int v;
  uint uVar8;
  
  v = 0;
  uVar5 = 0;
  uVar8 = 0;
  uVar6 = 0;
  pGVar7 = p;
  do {
    iVar1 = (int)pGVar7;
    uVar4 = p->vCos->nSize - p->nRegs;
    if ((int)uVar4 <= v) {
LAB_001f9a4e:
      Abc_Print(iVar1,"Outputs = %7d.  Unsat = %7d.  Sat = %7d.  Undec = %7d.\n",(ulong)uVar4,
                (ulong)uVar8,(ulong)uVar5,(ulong)uVar6);
      return;
    }
    pGVar7 = p;
    pGVar2 = Gia_ManCo(p,v);
    iVar1 = (int)pGVar7;
    if (pGVar2 == (Gia_Obj_t *)0x0) {
      uVar4 = p->vCos->nSize - p->nRegs;
      goto LAB_001f9a4e;
    }
    pGVar3 = (Gia_Obj_t *)
             ((ulong)((uint)*(undefined8 *)pGVar2 >> 0x1d & 1) ^
             (ulong)(pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)));
    if (p->pObjs == pGVar3) {
      uVar8 = uVar8 + 1;
    }
    else {
      if (((ulong)pGVar3 ^ (ulong)p->pObjs) != 1) {
        pGVar7 = p;
        iVar1 = Gia_ObjIsPi(p,(Gia_Obj_t *)
                              ((ulong)(pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff))
                              & 0xfffffffffffffffe));
        if (iVar1 == 0) {
          uVar6 = uVar6 + 1;
          goto LAB_001f9a3e;
        }
      }
      uVar5 = uVar5 + 1;
    }
LAB_001f9a3e:
    v = v + 1;
  } while( true );
}

Assistant:

void Gia_ManPrintMiterStatus( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pChild;
    int i, nSat = 0, nUnsat = 0, nUndec = 0, iOut = -1;
    Gia_ManForEachPo( p, pObj, i )
    {
        pChild = Gia_ObjChild0(pObj);
        // check if the output is constant 0
        if ( pChild == Gia_ManConst0(p) )
            nUnsat++;
        // check if the output is constant 1
        else if ( pChild == Gia_ManConst1(p) )
        {
            nSat++;
            if ( iOut == -1 )
                iOut = i;
        }
        // check if the output is a primary input
        else if ( Gia_ObjIsPi(p, Gia_Regular(pChild)) )
        {
            nSat++;
            if ( iOut == -1 )
                iOut = i;
        }
/*
        // check if the output is 1 for the 0000 pattern
        else if ( Gia_Regular(pChild)->fPhase != (unsigned)Gia_IsComplement(pChild) )
        {
            nSat++;
            if ( iOut == -1 )
                iOut = i;
        }
*/
        else
            nUndec++;
    }
    Abc_Print( 1, "Outputs = %7d.  Unsat = %7d.  Sat = %7d.  Undec = %7d.\n",
        Gia_ManPoNum(p), nUnsat, nSat, nUndec );
}